

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

int ply_read_chunk_reverse(p_ply ply,void *anybuffer,size_t size)

{
  int iVar1;
  
  iVar1 = ply_read_chunk(ply,anybuffer,size);
  if (iVar1 != 0) {
    ply_reverse(anybuffer,size);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int ply_read_chunk_reverse(p_ply ply, void *anybuffer, size_t size) {
    if (!ply_read_chunk(ply, anybuffer, size)) return 0;
    ply_reverse(anybuffer, size);
    return 1;
}